

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Writer.h
# Opt level: O3

AlignmentLines *
Alnout::Writer<DNA>::ExtractAlignmentLines
          (AlignmentLines *__return_storage_ptr__,Sequence<DNA> *query,Sequence<DNA> *target,
          Cigar *alignment,size_t *outNumCols,size_t *outNumMatches,size_t *outNumGaps)

{
  CigarOp CVar1;
  CigarEntry CVar2;
  _Map_pointer ppCVar3;
  CigarEntry CVar4;
  long lVar5;
  size_t sVar6;
  undefined8 *local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  size_t local_1c8;
  ulong uStack_1c0;
  undefined8 *local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 *local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  CigarEntry local_170;
  CigarEntry local_168;
  CigarEntry local_160;
  size_t *local_158;
  size_t *local_150;
  undefined1 local_148 [16];
  _Alloc_hider local_138;
  size_type local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  size_t local_118;
  ulong uStack_110;
  _Alloc_hider local_108;
  size_type local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  _Alloc_hider local_e8;
  size_type local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  Sequence<DNA> *local_c8;
  Sequence<DNA> *local_c0;
  _Elt_pointer local_b8;
  undefined1 local_b0 [8];
  Cigar cigar;
  size_t local_58;
  size_t local_50;
  AlignmentLines *lines;
  ulong local_38;
  
  local_c8 = query;
  local_c0 = target;
  std::deque<CigarEntry,_std::allocator<CigarEntry>_>::deque
            ((deque<CigarEntry,_std::allocator<CigarEntry>_> *)local_b0,
             &alignment->super_deque<CigarEntry,_std::allocator<CigarEntry>_>);
  CVar2 = (CigarEntry)
          cigar.super_deque<CigarEntry,_std::allocator<CigarEntry>_>.
          super__Deque_base<CigarEntry,_std::allocator<CigarEntry>_>._M_impl.super__Deque_impl_data.
          _M_start._M_node;
  local_158 = outNumMatches;
  local_150 = outNumCols;
  if (cigar.super_deque<CigarEntry,_std::allocator<CigarEntry>_>.
      super__Deque_base<CigarEntry,_std::allocator<CigarEntry>_>._M_impl.super__Deque_impl_data.
      _M_start._M_node ==
      (_Map_pointer)
      cigar.super_deque<CigarEntry,_std::allocator<CigarEntry>_>.
      super__Deque_base<CigarEntry,_std::allocator<CigarEntry>_>._M_impl.super__Deque_impl_data.
      _M_map_size) {
LAB_0014f17e:
    local_38 = 0;
    lines = (AlignmentLines *)0x0;
  }
  else {
    if (*(char *)(cigar.super_deque<CigarEntry,_std::allocator<CigarEntry>_>.
                  super__Deque_base<CigarEntry,_std::allocator<CigarEntry>_>._M_impl.
                  super__Deque_impl_data._M_map_size + 4) == 'I') {
      lines = (AlignmentLines *)
              (long)*(int *)cigar.super_deque<CigarEntry,_std::allocator<CigarEntry>_>.
                            super__Deque_base<CigarEntry,_std::allocator<CigarEntry>_>._M_impl.
                            super__Deque_impl_data._M_map_size;
      if ((_Elt_pointer)
          cigar.super_deque<CigarEntry,_std::allocator<CigarEntry>_>.
          super__Deque_base<CigarEntry,_std::allocator<CigarEntry>_>._M_impl.super__Deque_impl_data.
          _M_map_size ==
          cigar.super_deque<CigarEntry,_std::allocator<CigarEntry>_>.
          super__Deque_base<CigarEntry,_std::allocator<CigarEntry>_>._M_impl.super__Deque_impl_data.
          _M_start._M_first + -1) {
        operator_delete(cigar.super_deque<CigarEntry,_std::allocator<CigarEntry>_>.
                        super__Deque_base<CigarEntry,_std::allocator<CigarEntry>_>._M_impl.
                        super__Deque_impl_data._M_start._M_cur);
        CVar2 = cigar.super_deque<CigarEntry,_std::allocator<CigarEntry>_>.
                super__Deque_base<CigarEntry,_std::allocator<CigarEntry>_>._M_impl.
                super__Deque_impl_data._M_start._M_last[1];
        cigar.super_deque<CigarEntry,_std::allocator<CigarEntry>_>.
        super__Deque_base<CigarEntry,_std::allocator<CigarEntry>_>._M_impl.super__Deque_impl_data.
        _M_start._M_first = (_Elt_pointer)((long)CVar2 + 0x200);
        local_38 = 0;
        cigar.super_deque<CigarEntry,_std::allocator<CigarEntry>_>.
        super__Deque_base<CigarEntry,_std::allocator<CigarEntry>_>._M_impl.super__Deque_impl_data.
        _M_map_size = (size_t)CVar2;
        cigar.super_deque<CigarEntry,_std::allocator<CigarEntry>_>.
        super__Deque_base<CigarEntry,_std::allocator<CigarEntry>_>._M_impl.super__Deque_impl_data.
        _M_start._M_cur = (_Elt_pointer)CVar2;
        cigar.super_deque<CigarEntry,_std::allocator<CigarEntry>_>.
        super__Deque_base<CigarEntry,_std::allocator<CigarEntry>_>._M_impl.super__Deque_impl_data.
        _M_start._M_last =
             cigar.super_deque<CigarEntry,_std::allocator<CigarEntry>_>.
             super__Deque_base<CigarEntry,_std::allocator<CigarEntry>_>._M_impl.
             super__Deque_impl_data._M_start._M_last + 1;
        goto LAB_0014f1f3;
      }
      local_38 = 0;
    }
    else {
      CVar2 = (CigarEntry)
              cigar.super_deque<CigarEntry,_std::allocator<CigarEntry>_>.
              super__Deque_base<CigarEntry,_std::allocator<CigarEntry>_>._M_impl.
              super__Deque_impl_data._M_map_size;
      if (*(char *)(cigar.super_deque<CigarEntry,_std::allocator<CigarEntry>_>.
                    super__Deque_base<CigarEntry,_std::allocator<CigarEntry>_>._M_impl.
                    super__Deque_impl_data._M_map_size + 4) != 'D') goto LAB_0014f17e;
      local_38 = (ulong)*(int *)cigar.super_deque<CigarEntry,_std::allocator<CigarEntry>_>.
                                super__Deque_base<CigarEntry,_std::allocator<CigarEntry>_>._M_impl.
                                super__Deque_impl_data._M_map_size;
      if ((_Elt_pointer)
          cigar.super_deque<CigarEntry,_std::allocator<CigarEntry>_>.
          super__Deque_base<CigarEntry,_std::allocator<CigarEntry>_>._M_impl.super__Deque_impl_data.
          _M_map_size ==
          cigar.super_deque<CigarEntry,_std::allocator<CigarEntry>_>.
          super__Deque_base<CigarEntry,_std::allocator<CigarEntry>_>._M_impl.super__Deque_impl_data.
          _M_start._M_first + -1) {
        operator_delete(cigar.super_deque<CigarEntry,_std::allocator<CigarEntry>_>.
                        super__Deque_base<CigarEntry,_std::allocator<CigarEntry>_>._M_impl.
                        super__Deque_impl_data._M_start._M_cur);
        CVar2 = cigar.super_deque<CigarEntry,_std::allocator<CigarEntry>_>.
                super__Deque_base<CigarEntry,_std::allocator<CigarEntry>_>._M_impl.
                super__Deque_impl_data._M_start._M_last[1];
        cigar.super_deque<CigarEntry,_std::allocator<CigarEntry>_>.
        super__Deque_base<CigarEntry,_std::allocator<CigarEntry>_>._M_impl.super__Deque_impl_data.
        _M_start._M_first = (_Elt_pointer)((long)CVar2 + 0x200);
        lines = (AlignmentLines *)0x0;
        cigar.super_deque<CigarEntry,_std::allocator<CigarEntry>_>.
        super__Deque_base<CigarEntry,_std::allocator<CigarEntry>_>._M_impl.super__Deque_impl_data.
        _M_map_size = (size_t)CVar2;
        cigar.super_deque<CigarEntry,_std::allocator<CigarEntry>_>.
        super__Deque_base<CigarEntry,_std::allocator<CigarEntry>_>._M_impl.super__Deque_impl_data.
        _M_start._M_cur = (_Elt_pointer)CVar2;
        cigar.super_deque<CigarEntry,_std::allocator<CigarEntry>_>.
        super__Deque_base<CigarEntry,_std::allocator<CigarEntry>_>._M_impl.super__Deque_impl_data.
        _M_start._M_last =
             cigar.super_deque<CigarEntry,_std::allocator<CigarEntry>_>.
             super__Deque_base<CigarEntry,_std::allocator<CigarEntry>_>._M_impl.
             super__Deque_impl_data._M_start._M_last + 1;
        goto LAB_0014f1f3;
      }
      lines = (AlignmentLines *)0x0;
    }
    CVar2 = (CigarEntry)
            (cigar.super_deque<CigarEntry,_std::allocator<CigarEntry>_>.
             super__Deque_base<CigarEntry,_std::allocator<CigarEntry>_>._M_impl.
             super__Deque_impl_data._M_map_size + 8);
    cigar.super_deque<CigarEntry,_std::allocator<CigarEntry>_>.
    super__Deque_base<CigarEntry,_std::allocator<CigarEntry>_>._M_impl.super__Deque_impl_data.
    _M_map_size = (size_t)CVar2;
  }
LAB_0014f1f3:
  if ((CigarEntry)
      cigar.super_deque<CigarEntry,_std::allocator<CigarEntry>_>.
      super__Deque_base<CigarEntry,_std::allocator<CigarEntry>_>._M_impl.super__Deque_impl_data.
      _M_start._M_node != CVar2) {
    ppCVar3 = cigar.super_deque<CigarEntry,_std::allocator<CigarEntry>_>.
              super__Deque_base<CigarEntry,_std::allocator<CigarEntry>_>._M_impl.
              super__Deque_impl_data._M_start._M_node;
    if ((_Elt_pointer)
        cigar.super_deque<CigarEntry,_std::allocator<CigarEntry>_>.
        super__Deque_base<CigarEntry,_std::allocator<CigarEntry>_>._M_impl.super__Deque_impl_data.
        _M_start._M_node ==
        cigar.super_deque<CigarEntry,_std::allocator<CigarEntry>_>.
        super__Deque_base<CigarEntry,_std::allocator<CigarEntry>_>._M_impl.super__Deque_impl_data.
        _M_finish._M_cur) {
      ppCVar3 = (_Map_pointer)
                ((long)cigar.super_deque<CigarEntry,_std::allocator<CigarEntry>_>.
                       super__Deque_base<CigarEntry,_std::allocator<CigarEntry>_>._M_impl.
                       super__Deque_impl_data._M_finish._M_last[-1] + 0x200);
    }
    if ((*(char *)((long)ppCVar3 + -4) == 'I') || (*(char *)((long)ppCVar3 + -4) == 'D')) {
      if ((_Elt_pointer)
          cigar.super_deque<CigarEntry,_std::allocator<CigarEntry>_>.
          super__Deque_base<CigarEntry,_std::allocator<CigarEntry>_>._M_impl.super__Deque_impl_data.
          _M_start._M_node ==
          cigar.super_deque<CigarEntry,_std::allocator<CigarEntry>_>.
          super__Deque_base<CigarEntry,_std::allocator<CigarEntry>_>._M_impl.super__Deque_impl_data.
          _M_finish._M_cur) {
        operator_delete(cigar.super_deque<CigarEntry,_std::allocator<CigarEntry>_>.
                        super__Deque_base<CigarEntry,_std::allocator<CigarEntry>_>._M_impl.
                        super__Deque_impl_data._M_finish._M_cur);
        cigar.super_deque<CigarEntry,_std::allocator<CigarEntry>_>.
        super__Deque_base<CigarEntry,_std::allocator<CigarEntry>_>._M_impl.super__Deque_impl_data.
        _M_finish._M_cur =
             *(_Elt_pointer *)
              (cigar.super_deque<CigarEntry,_std::allocator<CigarEntry>_>.
               super__Deque_base<CigarEntry,_std::allocator<CigarEntry>_>._M_impl.
               super__Deque_impl_data._M_finish._M_last + -1);
        cigar.super_deque<CigarEntry,_std::allocator<CigarEntry>_>.
        super__Deque_base<CigarEntry,_std::allocator<CigarEntry>_>._M_impl.super__Deque_impl_data.
        _M_finish._M_first =
             (_Elt_pointer)
             ((long)cigar.super_deque<CigarEntry,_std::allocator<CigarEntry>_>.
                    super__Deque_base<CigarEntry,_std::allocator<CigarEntry>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_cur + 0x200);
        cigar.super_deque<CigarEntry,_std::allocator<CigarEntry>_>.
        super__Deque_base<CigarEntry,_std::allocator<CigarEntry>_>._M_impl.super__Deque_impl_data.
        _M_start._M_node =
             (_Map_pointer)
             ((long)cigar.super_deque<CigarEntry,_std::allocator<CigarEntry>_>.
                    super__Deque_base<CigarEntry,_std::allocator<CigarEntry>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_cur + 0x1f8);
        cigar.super_deque<CigarEntry,_std::allocator<CigarEntry>_>.
        super__Deque_base<CigarEntry,_std::allocator<CigarEntry>_>._M_impl.super__Deque_impl_data.
        _M_finish._M_last =
             cigar.super_deque<CigarEntry,_std::allocator<CigarEntry>_>.
             super__Deque_base<CigarEntry,_std::allocator<CigarEntry>_>._M_impl.
             super__Deque_impl_data._M_finish._M_last + -1;
      }
      else {
        cigar.super_deque<CigarEntry,_std::allocator<CigarEntry>_>.
        super__Deque_base<CigarEntry,_std::allocator<CigarEntry>_>._M_impl.super__Deque_impl_data.
        _M_start._M_node =
             cigar.super_deque<CigarEntry,_std::allocator<CigarEntry>_>.
             super__Deque_base<CigarEntry,_std::allocator<CigarEntry>_>._M_impl.
             super__Deque_impl_data._M_start._M_node + -1;
      }
    }
  }
  local_138._M_p = (pointer)&local_128;
  local_130 = 0;
  local_128._M_local_buf[0] = '\0';
  local_108._M_p = (pointer)&local_f8;
  local_100 = 0;
  local_f8._M_local_buf[0] = '\0';
  local_e8._M_p = (pointer)&local_d8;
  local_e0 = 0;
  local_d8._M_local_buf[0] = '\0';
  local_148._0_8_ =
       (long)&(lines->
              super__Deque_base<Alnout::Writer<DNA>::AlignmentLine,_std::allocator<Alnout::Writer<DNA>::AlignmentLine>_>
              )._M_impl.super__Deque_impl_data._M_map + 1;
  local_118 = local_38 + 1;
  (__return_storage_ptr__->
  super__Deque_base<Alnout::Writer<DNA>::AlignmentLine,_std::allocator<Alnout::Writer<DNA>::AlignmentLine>_>
  )._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (__return_storage_ptr__->
  super__Deque_base<Alnout::Writer<DNA>::AlignmentLine,_std::allocator<Alnout::Writer<DNA>::AlignmentLine>_>
  )._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  (__return_storage_ptr__->
  super__Deque_base<Alnout::Writer<DNA>::AlignmentLine,_std::allocator<Alnout::Writer<DNA>::AlignmentLine>_>
  )._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (__return_storage_ptr__->
  super__Deque_base<Alnout::Writer<DNA>::AlignmentLine,_std::allocator<Alnout::Writer<DNA>::AlignmentLine>_>
  )._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (__return_storage_ptr__->
  super__Deque_base<Alnout::Writer<DNA>::AlignmentLine,_std::allocator<Alnout::Writer<DNA>::AlignmentLine>_>
  )._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (__return_storage_ptr__->
  super__Deque_base<Alnout::Writer<DNA>::AlignmentLine,_std::allocator<Alnout::Writer<DNA>::AlignmentLine>_>
  )._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (__return_storage_ptr__->
  super__Deque_base<Alnout::Writer<DNA>::AlignmentLine,_std::allocator<Alnout::Writer<DNA>::AlignmentLine>_>
  )._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (__return_storage_ptr__->
  super__Deque_base<Alnout::Writer<DNA>::AlignmentLine,_std::allocator<Alnout::Writer<DNA>::AlignmentLine>_>
  )._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (__return_storage_ptr__->
  super__Deque_base<Alnout::Writer<DNA>::AlignmentLine,_std::allocator<Alnout::Writer<DNA>::AlignmentLine>_>
  )._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (__return_storage_ptr__->
  super__Deque_base<Alnout::Writer<DNA>::AlignmentLine,_std::allocator<Alnout::Writer<DNA>::AlignmentLine>_>
  )._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::
  _Deque_base<Alnout::Writer<DNA>::AlignmentLine,_std::allocator<Alnout::Writer<DNA>::AlignmentLine>_>
  ::_M_initialize_map(&__return_storage_ptr__->
                       super__Deque_base<Alnout::Writer<DNA>::AlignmentLine,_std::allocator<Alnout::Writer<DNA>::AlignmentLine>_>
                      ,0);
  local_160 = (CigarEntry)
              cigar.super_deque<CigarEntry,_std::allocator<CigarEntry>_>.
              super__Deque_base<CigarEntry,_std::allocator<CigarEntry>_>._M_impl.
              super__Deque_impl_data._M_start._M_node;
  if ((_Map_pointer)
      cigar.super_deque<CigarEntry,_std::allocator<CigarEntry>_>.
      super__Deque_base<CigarEntry,_std::allocator<CigarEntry>_>._M_impl.super__Deque_impl_data.
      _M_map_size ==
      cigar.super_deque<CigarEntry,_std::allocator<CigarEntry>_>.
      super__Deque_base<CigarEntry,_std::allocator<CigarEntry>_>._M_impl.super__Deque_impl_data.
      _M_start._M_node) {
    local_58 = 0;
    local_50 = 0;
    cigar.super_deque<CigarEntry,_std::allocator<CigarEntry>_>.
    super__Deque_base<CigarEntry,_std::allocator<CigarEntry>_>._M_impl.super__Deque_impl_data.
    _M_finish._M_node = (_Map_pointer)0x0;
  }
  else {
    local_b8 = cigar.super_deque<CigarEntry,_std::allocator<CigarEntry>_>.
               super__Deque_base<CigarEntry,_std::allocator<CigarEntry>_>._M_impl.
               super__Deque_impl_data._M_start._M_last;
    cigar.super_deque<CigarEntry,_std::allocator<CigarEntry>_>.
    super__Deque_base<CigarEntry,_std::allocator<CigarEntry>_>._M_impl.super__Deque_impl_data.
    _M_finish._M_node = (_Map_pointer)0x0;
    local_50 = 0;
    local_58 = 0;
    CVar4 = (CigarEntry)
            cigar.super_deque<CigarEntry,_std::allocator<CigarEntry>_>.
            super__Deque_base<CigarEntry,_std::allocator<CigarEntry>_>._M_impl.
            super__Deque_impl_data._M_map_size;
    CVar2 = (CigarEntry)
            cigar.super_deque<CigarEntry,_std::allocator<CigarEntry>_>.
            super__Deque_base<CigarEntry,_std::allocator<CigarEntry>_>._M_impl.
            super__Deque_impl_data._M_start._M_first;
    do {
      if (0 < *(int *)CVar4) {
        lVar5 = 0;
        sVar6 = local_50;
        local_170 = CVar4;
        local_168 = CVar2;
        do {
          sVar6 = sVar6 + 1;
          CVar1 = *(CigarOp *)((long)local_170 + 4);
          if (CVar1 < Insertion) {
            if (CVar1 == Match) {
              cigar.super_deque<CigarEntry,_std::allocator<CigarEntry>_>.
              super__Deque_base<CigarEntry,_std::allocator<CigarEntry>_>._M_impl.
              super__Deque_impl_data._M_finish._M_node =
                   (_Map_pointer)
                   ((long)cigar.super_deque<CigarEntry,_std::allocator<CigarEntry>_>.
                          super__Deque_base<CigarEntry,_std::allocator<CigarEntry>_>._M_impl.
                          super__Deque_impl_data._M_finish._M_node + 1);
LAB_0014f421:
              if (((AlignmentLines *)(local_c8->sequence)._M_string_length <= lines) ||
                 (std::__cxx11::string::push_back((char)&local_138),
                 (local_c0->sequence)._M_string_length <= local_38)) {
LAB_0014f788:
                __assert_fail("index >= 0 && index < sequence.size()",
                              "/workspace/llm4binary/github/license_c_cmakelists/stevschmid[P]nsearch/libnsearch/include/nsearch/Sequence.h"
                              ,0x32,
                              "char Sequence<DNA>::operator[](const size_t) const [Alphabet = DNA]")
                ;
              }
              std::__cxx11::string::push_back((char)&local_108);
              std::__cxx11::string::push_back((char)&local_e8);
              lines = (AlignmentLines *)
                      ((long)&(lines->
                              super__Deque_base<Alnout::Writer<DNA>::AlignmentLine,_std::allocator<Alnout::Writer<DNA>::AlignmentLine>_>
                              )._M_impl.super__Deque_impl_data._M_map + 1);
              local_38 = local_38 + 1;
            }
            else if (CVar1 == Deletion) {
              std::__cxx11::string::push_back((char)&local_138);
              if ((local_c0->sequence)._M_string_length <= local_38) goto LAB_0014f788;
              std::__cxx11::string::push_back((char)&local_108);
              std::__cxx11::string::push_back((char)&local_e8);
              local_38 = local_38 + 1;
LAB_0014f414:
              local_58 = local_58 + 1;
            }
          }
          else {
            if (CVar1 == Mismatch) goto LAB_0014f421;
            if (CVar1 == Insertion) {
              std::__cxx11::string::push_back((char)&local_108);
              if ((AlignmentLines *)(local_c8->sequence)._M_string_length <= lines)
              goto LAB_0014f788;
              std::__cxx11::string::push_back((char)&local_138);
              std::__cxx11::string::push_back((char)&local_e8);
              lines = (AlignmentLines *)
                      ((long)&(lines->
                              super__Deque_base<Alnout::Writer<DNA>::AlignmentLine,_std::allocator<Alnout::Writer<DNA>::AlignmentLine>_>
                              )._M_impl.super__Deque_impl_data._M_map + 1);
              goto LAB_0014f414;
            }
          }
          if ((sVar6 / 0x3c) * -0x3c + 1 + local_50 + lVar5 == 0) {
            local_148._8_8_ = lines;
            uStack_110 = local_38;
            std::
            deque<Alnout::Writer<DNA>::AlignmentLine,_std::allocator<Alnout::Writer<DNA>::AlignmentLine>_>
            ::push_back(__return_storage_ptr__,(value_type *)local_148);
            uStack_1e0 = 0;
            uStack_1d0 = 0;
            uStack_1b0 = 0;
            uStack_1a0 = 0;
            uStack_190 = 0;
            uStack_180 = 0;
            local_1c8 = 0;
            uStack_1c0 = 0;
            local_1d8 = 0;
            local_1b8 = &local_1a8;
            local_1a8 = 0;
            local_188 = 0;
            local_148._0_8_ = 0;
            local_148._8_8_ = (AlignmentLines *)0x0;
            local_1e8 = &local_1d8;
            local_198 = &local_188;
            std::__cxx11::string::operator=((string *)&local_138,(string *)&local_1e8);
            local_118 = local_1c8;
            uStack_110 = uStack_1c0;
            std::__cxx11::string::operator=((string *)&local_108,(string *)&local_1b8);
            std::__cxx11::string::operator=((string *)&local_e8,(string *)&local_198);
            if (local_198 != &local_188) {
              operator_delete(local_198);
            }
            if (local_1b8 != &local_1a8) {
              operator_delete(local_1b8);
            }
            if (local_1e8 != &local_1d8) {
              operator_delete(local_1e8);
            }
            local_148._0_8_ =
                 (long)&(lines->
                        super__Deque_base<Alnout::Writer<DNA>::AlignmentLine,_std::allocator<Alnout::Writer<DNA>::AlignmentLine>_>
                        )._M_impl.super__Deque_impl_data._M_map + 1;
            local_118 = local_38 + 1;
          }
          lVar5 = lVar5 + 1;
        } while ((int)lVar5 < *(int *)local_170);
        local_50 = local_50 + lVar5;
        CVar4 = local_170;
        CVar2 = local_168;
      }
      CVar4 = (CigarEntry)((long)CVar4 + 8);
      if (CVar4 == CVar2) {
        CVar4 = local_b8[1];
        local_b8 = local_b8 + 1;
        CVar2 = (CigarEntry)((long)CVar4 + 0x200);
      }
    } while (CVar4 != local_160);
  }
  if (local_e0 != 0) {
    local_148._8_8_ = lines;
    uStack_110 = local_38;
    std::
    deque<Alnout::Writer<DNA>::AlignmentLine,_std::allocator<Alnout::Writer<DNA>::AlignmentLine>_>::
    push_back(__return_storage_ptr__,(value_type *)local_148);
  }
  if (local_150 != (size_t *)0x0) {
    *local_150 = local_50;
  }
  if (local_158 != (size_t *)0x0) {
    *local_158 = (size_t)cigar.super_deque<CigarEntry,_std::allocator<CigarEntry>_>.
                         super__Deque_base<CigarEntry,_std::allocator<CigarEntry>_>._M_impl.
                         super__Deque_impl_data._M_finish._M_node;
  }
  if (outNumGaps != (size_t *)0x0) {
    *outNumGaps = local_58;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_p != &local_d8) {
    operator_delete(local_e8._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_p != &local_f8) {
    operator_delete(local_108._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_p != &local_128) {
    operator_delete(local_138._M_p);
  }
  std::_Deque_base<CigarEntry,_std::allocator<CigarEntry>_>::~_Deque_base
            ((_Deque_base<CigarEntry,_std::allocator<CigarEntry>_> *)local_b0);
  return __return_storage_ptr__;
}

Assistant:

static AlignmentLines ExtractAlignmentLines(
    const Sequence< Alphabet >& query, const Sequence< Alphabet >& target,
    const Cigar& alignment, size_t* outNumCols = NULL,
    size_t* outNumMatches = NULL, size_t* outNumGaps = NULL ) {
    Cigar cigar = alignment;

    size_t queryStart  = 0;
    size_t targetStart = 0;

    // Dont take left terminal gap into account
    if( !cigar.empty() ) {
      const auto& fce = cigar.front();
      if( fce.op == CigarOp::Deletion ) {
        targetStart = fce.count;
        cigar.pop_front();
      } else if( fce.op == CigarOp::Insertion ) {
        queryStart = fce.count;
        cigar.pop_front();
      }
    }

    // Don't take right terminal gap into account
    if( !cigar.empty() ) {
      const auto& bce = cigar.back();
      if( bce.op == CigarOp::Deletion ) {
        cigar.pop_back();
      } else if( bce.op == CigarOp::Insertion ) {
        cigar.pop_back();
      }
    }

    bool   match;
    size_t numMatches = 0;
    size_t numCols    = 0;
    size_t numGaps    = 0;

    size_t qcount = queryStart;
    size_t tcount = targetStart;

    AlignmentLine line;
    line.qs = queryStart + 1;
    line.ts = targetStart + 1;

    AlignmentLines lines;

    for( auto& c : cigar ) {
      for( int i = 0; i < c.count; i++ ) {
        switch( c.op ) {
          case CigarOp::Insertion:
            line.t += '-';
            line.q += query[ qcount++ ];
            line.a += ' ';
            numGaps++;
            break;

          case CigarOp::Deletion:
            line.q += '-';
            line.t += target[ tcount++ ];
            line.a += ' ';
            numGaps++;
            break;

          case CigarOp::Match: // specific for match
            numMatches++;
          case CigarOp::Mismatch: // match and mismatch
            line.q += query[ qcount++ ];
            line.t += target[ tcount++ ];
            {
              const char a = line.q.back(), b = line.t.back();
              line.a += MatchSymbol( a, b );
            }
            break;

          default:
            break;
        }

        numCols++;
        if( numCols % MaxLineLength == 0 ) {
          line.qe = qcount;
          line.te = tcount;
          lines.push_back( line );

          // Start new line
          line    = AlignmentLine();
          line.qs = qcount + 1;
          line.ts = tcount + 1;
        }
      }
    }

    if( !line.a.empty() ) {
      line.qe = qcount;
      line.te = tcount;
      lines.push_back( line );
    }

    if( outNumCols )
      *outNumCols = numCols;

    if( outNumMatches )
      *outNumMatches = numMatches;

    if( outNumGaps )
      *outNumGaps = numGaps;

    return lines;
  }